

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::greedilyOrientFaces(SurfaceMesh *this)

{
  ParentMeshT *pPVar1;
  unsigned_long uVar2;
  Face f_00;
  bool bVar3;
  size_t i;
  unsigned_long uVar4;
  unsigned_long uVar5;
  Face fO;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> toProcess;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceData<double> processed;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  Edge local_108;
  _Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  local_f8;
  Edge local_d8;
  SurfaceMesh *local_c8;
  value_type local_c0;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_b0;
  MeshData<geometrycentral::surface::Face,_double> local_98;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_60;
  RangeSetBase<geometrycentral::surface::FaceRangeF> local_48;
  
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  MeshData<geometrycentral::surface::Face,_double>::MeshData(&local_98,this,0.0);
  local_48.iEnd = this->nFacesFillCount;
  local_48.iStart = 0;
  local_48.mesh = this;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin(&local_b0,&local_48);
  local_c8 = this;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end(&local_60,&local_48);
  while (local_b0.iCurr != local_60.iCurr) {
    local_c0.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
    mesh = local_b0.mesh;
    local_c0.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
    ind = local_b0.iCurr;
    if ((local_98.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[local_b0.iCurr] == 0.0) &&
       (!NAN(local_98.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[local_b0.iCurr]))) {
      ::std::vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ::push_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                   *)&local_f8,&local_c0);
      local_98.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [local_c0.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
       .ind] = 1.0;
      while (local_f8._M_impl.super__Vector_impl_data._M_start !=
             local_f8._M_impl.super__Vector_impl_data._M_finish) {
        pPVar1 = local_f8._M_impl.super__Vector_impl_data._M_finish[-1].
                 super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
        bVar3 = true;
        uVar2 = (pPVar1->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_f8._M_impl.super__Vector_impl_data._M_finish[-1].
                 super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                 .ind];
        local_f8._M_impl.super__Vector_impl_data._M_finish =
             local_f8._M_impl.super__Vector_impl_data._M_finish + -1;
        for (uVar5 = uVar2; (bVar3 || (uVar5 != uVar2));
            uVar5 = (pPVar1->heNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5]) {
          if (pPVar1->useImplicitTwinFlag == true) {
            local_108.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
                 = uVar5 >> 1;
          }
          else {
            local_108.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
                 = (pPVar1->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
          }
          local_108.
          super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
               = pPVar1;
          bVar3 = Edge::isBoundary(&local_108);
          if (!bVar3) {
            if (pPVar1->useImplicitTwinFlag == true) {
              local_d8.
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              ind = uVar5 >> 1;
            }
            else {
              local_d8.
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              ind = (pPVar1->heEdgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            }
            local_d8.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
            mesh = pPVar1;
            bVar3 = Edge::isManifold(&local_d8);
            if (bVar3) {
              if (pPVar1->useImplicitTwinFlag == true) {
                uVar4 = uVar5 ^ 1;
              }
              else {
                uVar4 = (pPVar1->heSiblingArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5];
              }
              local_108.
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              ind = (pPVar1->heFaceArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4];
              local_108.
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              mesh = pPVar1;
              if ((local_98.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data
                   [local_108.
                    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                    .ind] == 0.0) &&
                 (!NAN(local_98.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data
                       [local_108.
                        super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                        .ind]))) {
                if (pPVar1->useImplicitTwinFlag == false) {
                  local_d8.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .ind = (pPVar1->heEdgeArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5];
                }
                else {
                  local_d8.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .ind = uVar5 >> 1;
                }
                local_d8.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                .mesh = pPVar1;
                bVar3 = Edge::isOriented(&local_d8);
                if (!bVar3) {
                  f_00.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .ind = local_108.
                         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                         .ind;
                  f_00.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh = local_108.
                          super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                          .mesh;
                  invertOrientation(local_c8,f_00);
                }
                ::std::
                vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                ::push_back((vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                             *)&local_f8,(value_type *)&local_108);
                local_98.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data
                [local_108.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .ind] = 1.0;
              }
            }
          }
          bVar3 = false;
        }
      }
    }
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&local_b0);
  }
  MeshData<geometrycentral::surface::Face,_double>::~MeshData(&local_98);
  ::std::
  _Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
  ~_Vector_base(&local_f8);
  return;
}

Assistant:

void SurfaceMesh::greedilyOrientFaces() {
  // TODO this is only lightly tested. Write some better tests.
  std::vector<Face> toProcess;
  FaceData<double> processed(*this, false);
  for (Face f : faces()) {
    if (processed[f]) continue;

    // start a new search
    toProcess.push_back(f);
    processed[f] = true;

    // cover the whole component
    while (!toProcess.empty()) {
      Face curr = toProcess.back();
      toProcess.pop_back();

      for (Halfedge he : curr.adjacentHalfedges()) {
        if (he.edge().isBoundary() || !he.edge().isManifold()) continue;
        Face fO = he.sibling().face();
        if (processed[fO]) continue;

        if (!he.edge().isOriented()) {
          invertOrientation(fO);
        }

        toProcess.push_back(fO);
        processed[fO] = true;
      }
    }
  }
}